

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pageview.cpp
# Opt level: O0

void __thiscall QtMWidgets::PageView::setShowPageControl(PageView *this,bool show)

{
  PageViewPrivate *pPVar1;
  bool show_local;
  PageView *this_local;
  
  pPVar1 = QScopedPointer<QtMWidgets::PageViewPrivate,_QScopedPointerDeleter<QtMWidgets::PageViewPrivate>_>
           ::operator->(&this->d);
  if ((bool)(pPVar1->showPageControl & 1U) != show) {
    pPVar1 = QScopedPointer<QtMWidgets::PageViewPrivate,_QScopedPointerDeleter<QtMWidgets::PageViewPrivate>_>
             ::operator->(&this->d);
    pPVar1->showPageControl = show;
    pPVar1 = QScopedPointer<QtMWidgets::PageViewPrivate,_QScopedPointerDeleter<QtMWidgets::PageViewPrivate>_>
             ::operator->(&this->d);
    if ((pPVar1->showPageControl & 1U) == 0) {
      QScopedPointer<QtMWidgets::PageViewPrivate,_QScopedPointerDeleter<QtMWidgets::PageViewPrivate>_>
      ::operator->(&this->d);
      QWidget::hide();
    }
    else {
      QScopedPointer<QtMWidgets::PageViewPrivate,_QScopedPointerDeleter<QtMWidgets::PageViewPrivate>_>
      ::operator->(&this->d);
      QWidget::raise();
      QScopedPointer<QtMWidgets::PageViewPrivate,_QScopedPointerDeleter<QtMWidgets::PageViewPrivate>_>
      ::operator->(&this->d);
      QWidget::show();
    }
  }
  return;
}

Assistant:

void
PageView::setShowPageControl( bool show )
{
	if( d->showPageControl != show )
	{
		d->showPageControl = show;

		if( d->showPageControl )
		{
			d->control->raise();
			d->control->show();
		}
		else
			d->control->hide();
	}
}